

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
  *psVar2;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *this;
  dynamic_format_specs<char> *pdVar3;
  byte *pbVar4;
  byte *pbVar5;
  int iVar6;
  byte *local_18;
  
  local_18 = (byte *)begin;
  if (begin == end) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format.h"
                ,0xa8e,"");
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
    ::on_dynamic_precision<fmt::v7::detail::auto_id>
              (&handler->handler->
                super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
              );
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_18 = (byte *)(begin + 1);
      iVar6 = 0;
    }
    else {
      iVar6 = parse_nonnegative_int<char,fmt::v7::detail::precision_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&,char>&>
                        ((char **)&local_18,end,handler);
    }
    if ((local_18 == (byte *)end) || ((*local_18 != 0x3a && (*local_18 != 0x7d)))) {
LAB_0012f7dd:
      error_handler::on_error
                ((error_handler *)
                 (handler->handler->
                 super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
                 ).context_,"invalid format string");
    }
    psVar2 = handler->handler;
    this = (psVar2->
           super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
           ).context_;
    if (0 < this->next_arg_id_) {
      error_handler::on_error
                ((error_handler *)this,"cannot switch from automatic to manual argument indexing");
    }
    this->next_arg_id_ = -1;
    pdVar3 = (psVar2->
             super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
             ).specs_;
    (pdVar3->precision_ref).kind = index;
    (pdVar3->precision_ref).val.index = iVar6;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_0012f7dd;
    pbVar5 = (byte *)(begin + 1);
    do {
      pbVar4 = pbVar5;
      local_18 = (byte *)end;
      if (pbVar4 == (byte *)end) break;
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (local_18 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    if (((long)local_18 - (long)begin < 0) ||
       ((long)(((handler->handler->
                super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
                ).context_)->format_str_).size_ < 0)) {
      local_18 = (byte *)begin;
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                  ,0x146,"negative value");
    }
    pdVar3 = (handler->handler->
             super_dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>
             ).specs_;
    (pdVar3->precision_ref).kind = name;
    (pdVar3->precision_ref).val.name.data_ = begin;
    (pdVar3->precision_ref).val.name.size_ = (long)local_18 - (long)begin;
  }
  return (char *)local_18;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}